

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O3

uint32_t __thiscall AmpIO::GetMotorCurrent(AmpIO *this,uint index)

{
  uint uVar1;
  
  uVar1 = 0;
  if (index < this->NumMotors) {
    uVar1 = (uint)(ushort)this->ReadBuffer[index + 4];
  }
  return uVar1;
}

Assistant:

uint32_t AmpIO::GetMotorCurrent(unsigned int index) const
{
    if (index >= NumMotors)
        return 0L;

    quadlet_t buff;
    buff = ReadBuffer[index+MOTOR_CURR_OFFSET];
    buff &= MOTOR_CURR_MASK;       // mask for applicable bits

    return static_cast<uint32_t>(buff) & ADC_MASK;
}